

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

PrecisionCase *
deqp::gls::BuiltinPrecisionTests::
createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,float,deqp::gls::BuiltinPrecisionTests::Void>>
          (Context *context,string *name,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func)

{
  int iVar1;
  PrecisionCase *this;
  undefined **ppuVar2;
  
  iVar1 = (*(func->super_FuncBase)._vptr_FuncBase[5])(func);
  if (iVar1 == 1) {
    this = (PrecisionCase *)operator_new(0x188);
    FuncCaseBase::FuncCaseBase((FuncCaseBase *)this,context,name,&func->super_FuncBase);
    ppuVar2 = &PTR__PrecisionCase_00b41f98;
  }
  else {
    if (iVar1 != -1) {
      return (PrecisionCase *)0x0;
    }
    this = (PrecisionCase *)operator_new(0x188);
    FuncCaseBase::FuncCaseBase((FuncCaseBase *)this,context,name,&func->super_FuncBase);
    ppuVar2 = &PTR__PrecisionCase_00b41e98;
  }
  (((PrecisionCase *)&this->super_TestCase)->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)ppuVar2;
  (((PrecisionCase *)&this[1].super_TestCase)->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)func;
  return this;
}

Assistant:

PrecisionCase* createFuncCase (const Context&	context,
							   const string&	name,
							   const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}